

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Output::blockScalarString(Output *this,StringRef *S)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  type Buffer_00;
  StringRef SVar5;
  StringRef InputData;
  uint local_b8;
  StringRef local_98;
  uint local_88;
  uint I;
  undefined1 local_78 [8];
  line_iterator Lines;
  bool local_50;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_38;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> Buffer;
  undefined1 auStack_28 [4];
  uint Indent;
  StringRef *local_18;
  StringRef *S_local;
  Output *this_local;
  
  local_18 = S;
  S_local = (StringRef *)this;
  bVar3 = SmallVectorBase::empty((SmallVectorBase *)&this->StateStack);
  if (!bVar3) {
    newLineCheck(this);
  }
  StringRef::StringRef((StringRef *)auStack_28," |");
  output(this,_auStack_28);
  outputNewLine(this);
  bVar3 = SmallVectorBase::empty((SmallVectorBase *)&this->StateStack);
  if (bVar3) {
    local_b8 = 1;
  }
  else {
    sVar4 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
    local_b8 = (uint)sVar4;
  }
  Buffer._M_t.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl._4_4_ = local_b8;
  pcVar1 = local_18->Data;
  pcVar2 = (char *)local_18->Length;
  StringRef::StringRef((StringRef *)&Lines.CurrentLine.Length,"");
  SVar5.Length = Lines.CurrentLine.Length;
  SVar5.Data = pcVar2;
  InputData.Length = (size_t)pcVar1;
  InputData.Data = (char *)&local_38;
  MemoryBuffer::getMemBuffer(InputData,SVar5,local_50);
  Buffer_00 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
              operator*(&local_38);
  line_iterator::line_iterator((line_iterator *)local_78,Buffer_00,false,'\0');
  while( true ) {
    bVar3 = line_iterator::is_at_end((line_iterator *)local_78);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    for (local_88 = 0;
        local_88 <
        Buffer._M_t.
        super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
        super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
        super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl._4_4_;
        local_88 = local_88 + 1) {
      StringRef::StringRef(&local_98,"  ");
      output(this,local_98);
    }
    SVar5 = line_iterator::operator*((line_iterator *)local_78);
    output(this,SVar5);
    outputNewLine(this);
    line_iterator::operator++((line_iterator *)local_78);
  }
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (&local_38);
  return;
}

Assistant:

void Output::blockScalarString(StringRef &S) {
  if (!StateStack.empty())
    newLineCheck();
  output(" |");
  outputNewLine();

  unsigned Indent = StateStack.empty() ? 1 : StateStack.size();

  auto Buffer = MemoryBuffer::getMemBuffer(S, "", false);
  for (line_iterator Lines(*Buffer, false); !Lines.is_at_end(); ++Lines) {
    for (unsigned I = 0; I < Indent; ++I) {
      output("  ");
    }
    output(*Lines);
    outputNewLine();
  }
}